

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O1

bool __thiscall
S2MinDistancePointTarget::VisitContainingShapes
          (S2MinDistancePointTarget *this,S2ShapeIndex *index,ShapeVisitor *visitor)

{
  bool bVar1;
  S2ContainsPointQuery<S2ShapeIndex> local_50;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_50.options_.vertex_model_ = SEMI_OPEN;
  local_50.index_ = index;
  (*index->_vptr_S2ShapeIndex[6])(&local_50.it_,index,2);
  pcStack_20 = std::
               _Function_handler<bool_(S2Shape_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2min_distance_targets.cc:52:15)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(S2Shape_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2min_distance_targets.cc:52:15)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  local_38._8_8_ = visitor;
  bVar1 = S2ContainsPointQuery<S2ShapeIndex>::VisitContainingShapes
                    (&local_50,&this->point_,(ShapeVisitor_conflict *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_50.it_.iter_._M_t.
      super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      ._M_t.
      super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl !=
      (__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_50.it_.iter_._M_t.
                          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl +
                8))();
  }
  return bVar1;
}

Assistant:

bool S2MinDistancePointTarget::VisitContainingShapes(
    const S2ShapeIndex& index, const ShapeVisitor& visitor) {
  return MakeS2ContainsPointQuery(&index).VisitContainingShapes(
      point_, [this, &visitor](S2Shape* shape) {
        return visitor(shape, point_);
      });
}